

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O2

void __thiscall QThreadPool::setExpiryTimeout(QThreadPool *this,int expiryTimeout)

{
  QObjectData *pQVar1;
  int iVar2;
  long in_FS_OFFSET;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QObject).d_ptr.d;
  local_30._0_8_ = &pQVar1[1].children.d.size;
  local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBasicMutex::lock((QBasicMutex *)local_30._0_8_);
  local_30[8] = true;
  iVar2 = 0x7fffffff;
  if ((uint)expiryTimeout < 0x7fffffff) {
    iVar2 = expiryTimeout;
  }
  *(int *)&pQVar1[3]._vptr_QObjectData = iVar2;
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QThreadPool::setExpiryTimeout(int expiryTimeout)
{
    Q_D(QThreadPool);
    QMutexLocker locker(&d->mutex);
    if (expiryTimeout < 0)
        d->expiryTimeout = decltype(d->expiryTimeout)::max();
    else
        d->expiryTimeout = expiryTimeout * 1ms;
}